

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O3

int per_put_few_bits(asn_per_outp_t *po,uint32_t bits,int obits)

{
  uint8_t *puVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  int unaff_R12D;
  size_t sVar10;
  uint local_3c;
  
  puVar1 = po->tmpspace;
  bVar3 = false;
  local_3c = bits;
  do {
    if (obits - 0x20U < 0xffffffe1) {
      iVar5 = -(uint)(obits != 0);
LAB_0014c4a4:
      if (bVar3) {
        iVar5 = unaff_R12D;
      }
      return iVar5;
    }
    uVar9 = po->nboff;
    if (uVar9 < 8) {
      puVar7 = po->buffer;
      uVar6 = po->nbits;
    }
    else {
      puVar7 = po->buffer + (uVar9 >> 3);
      po->buffer = puVar7;
      uVar6 = po->nbits - (uVar9 & 0xfffffffffffffff8);
      po->nbits = uVar6;
      uVar9 = (ulong)((uint)uVar9 & 7);
      po->nboff = uVar9;
    }
    uVar8 = uVar9 + (uint)obits;
    if (uVar6 < uVar8) {
      sVar10 = (size_t)((int)puVar7 - (int)puVar1);
      iVar5 = (*po->outper)(puVar1,sVar10,po->op_key);
      if (iVar5 < 0) {
        iVar5 = -1;
        goto LAB_0014c4a4;
      }
      uVar9 = po->nboff;
      if (uVar9 != 0) {
        po->tmpspace[0] = *po->buffer;
      }
      po->buffer = puVar1;
      po->nbits = 0x100;
      po->flushed_bytes = po->flushed_bytes + sVar10;
      uVar8 = (uint)obits + uVar9;
      puVar7 = puVar1;
    }
    local_3c = local_3c & ~(-1 << ((byte)obits & 0x1f));
    cVar4 = (char)uVar8;
    bVar2 = (byte)(-1 << (8U - (char)uVar9 & 0x1f));
    if (uVar8 < 9) {
      po->nboff = uVar8;
      *puVar7 = bVar2 & *puVar7 | (byte)(local_3c << (8U - cVar4 & 0x1f));
LAB_0014c4a2:
      iVar5 = 0;
      goto LAB_0014c4a4;
    }
    if (uVar8 < 0x11) {
      po->nboff = uVar8;
      iVar5 = local_3c << (0x10U - cVar4 & 0x1f);
      *puVar7 = (byte)((uint)iVar5 >> 8) | bVar2 & *puVar7;
      puVar7[1] = (byte)iVar5;
      goto LAB_0014c4a2;
    }
    if (uVar8 < 0x19) {
      po->nboff = uVar8;
      iVar5 = local_3c << (0x18U - cVar4 & 0x1f);
      *puVar7 = (byte)((uint)iVar5 >> 0x10) | bVar2 & *puVar7;
      puVar7[1] = (byte)((uint)iVar5 >> 8);
      puVar7[2] = (byte)iVar5;
      goto LAB_0014c4a2;
    }
    if (uVar8 < 0x20) {
      po->nboff = uVar8;
      iVar5 = local_3c << (-cVar4 & 0x1fU);
      *puVar7 = (byte)((uint)iVar5 >> 0x18) | bVar2 & *puVar7;
      puVar7[1] = (byte)((uint)iVar5 >> 0x10);
      puVar7[2] = (byte)((uint)iVar5 >> 8);
      puVar7[3] = (byte)iVar5;
      goto LAB_0014c4a2;
    }
    obits = obits - 0x18;
    per_put_few_bits(po,local_3c >> ((byte)obits & 0x1f),0x18);
    if (!bVar3) {
      unaff_R12D = 0;
    }
    bVar3 = true;
  } while( true );
}

Assistant:

int
per_put_few_bits(asn_per_outp_t *po, uint32_t bits, int obits) {
	size_t off;	/* Next after last bit offset */
	size_t omsk;	/* Existing last byte meaningful bits mask */
	uint8_t *buf;

	if(obits <= 0 || obits >= 32) return obits ? -1 : 0;

	ASN_DEBUG("[PER put %d bits %x to %p+%d bits]",
			obits, (int)bits, po->buffer, (int)po->nboff);

	/*
	 * Normalize position indicator.
	 */
	if(po->nboff >= 8) {
		po->buffer += (po->nboff >> 3);
		po->nbits  -= (po->nboff & ~0x07);
		po->nboff  &= 0x07;
	}

	/*
	 * Flush whole-bytes output, if necessary.
	 */
	if(po->nboff + obits > po->nbits) {
		int complete_bytes = (po->buffer - po->tmpspace);
		ASN_DEBUG("[PER output %ld complete + %ld]",
			(long)complete_bytes, (long)po->flushed_bytes);
		if(po->outper(po->tmpspace, complete_bytes, po->op_key) < 0)
			return -1;
		if(po->nboff)
			po->tmpspace[0] = po->buffer[0];
		po->buffer = po->tmpspace;
		po->nbits = 8 * sizeof(po->tmpspace);
		po->flushed_bytes += complete_bytes;
	}

	/*
	 * Now, due to sizeof(tmpspace), we are guaranteed large enough space.
	 */
	buf = po->buffer;
	omsk = ~((1 << (8 - po->nboff)) - 1);
	off = (po->nboff + obits);

	/* Clear data of debris before meaningful bits */
	bits &= (((uint32_t)1 << obits) - 1);

	ASN_DEBUG("[PER out %d %u/%x (t=%d,o=%d) %x&%x=%x]", obits,
		(int)bits, (int)bits,
		(int)po->nboff, (int)off,
		buf[0], (int)(omsk&0xff),
		(int)(buf[0] & omsk));

	if(off <= 8)	/* Completely within 1 byte */
		po->nboff = off,
		bits <<= (8 - off),
		buf[0] = (buf[0] & omsk) | bits;
	else if(off <= 16)
		po->nboff = off,
		bits <<= (16 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 8),
		buf[1] = bits;
	else if(off <= 24)
		po->nboff = off,
		bits <<= (24 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 16),
		buf[1] = bits >> 8,
		buf[2] = bits;
	else if(off <= 31)
		po->nboff = off,
		bits <<= (32 - off),
		buf[0] = (buf[0] & omsk) | (bits >> 24),
		buf[1] = bits >> 16,
		buf[2] = bits >> 8,
		buf[3] = bits;
	else {
		per_put_few_bits(po, bits >> (obits - 24), 24);
		per_put_few_bits(po, bits, obits - 24);
	}

	ASN_DEBUG("[PER out %u/%x => %02x buf+%ld]",
		(int)bits, (int)bits, buf[0],
		(long)(po->buffer - po->tmpspace));

	return 0;
}